

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::Receive(Client *this,int socket)

{
  ssize_t sVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  allocator<char> local_439;
  string msg;
  char buff [1024];
  
  memset(buff,0,0x400);
  sVar1 = recv(this->client_sock,buff,0x400,0);
  if (-1 < (int)sVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"",&local_439);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::append((char *)&msg);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&msg);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Error of receiving!";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void Client::Receive(int socket) {
    char buff[1024];
    memset(&buff, '\0', sizeof(buff));

    int __receive__ = recv(client_sock, buff, 1024, 0);

    if (__receive__ < 0) {
        throw "Error of receiving!";
        std::cout << "[!] Message has not received!" << std::endl;
        return;
    }

    std::string msg = "";

    msg += this->collocutor;
    msg += "> ";
    msg += buff;

    std::cout << msg << std::endl;
}